

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  ulong uVar1;
  size_type sVar2;
  const_reference this_00;
  string local_50;
  ulong local_30;
  size_t i;
  TypeVector *local_20;
  char *prefix_local;
  TypeVector *types_local;
  string *result;
  
  i._7_1_ = 0;
  local_20 = types;
  prefix_local = (char *)this;
  types_local = (TypeVector *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  if (local_20 != (TypeVector *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char *)local_20);
  }
  for (local_30 = 0; uVar1 = local_30,
      sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local),
      uVar1 < sVar2; local_30 = local_30 + 1) {
    this_00 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local,local_30);
    Type::GetName_abi_cxx11_(&local_50,this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = local_30;
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)prefix_local);
    if (uVar1 < sVar2 - 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += types[i].GetName();
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}